

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

Address * __thiscall cfd::core::Address::operator=(Address *this,Address *object)

{
  Address *object_local;
  Address *this_local;
  
  if (this != object) {
    this->type_ = object->type_;
    this->addr_type_ = object->addr_type_;
    this->witness_ver_ = object->witness_ver_;
    ::std::__cxx11::string::operator=((string *)&this->address_,(string *)&object->address_);
    ByteData::operator=(&this->hash_,&object->hash_);
    Pubkey::operator=(&this->pubkey_,&object->pubkey_);
    SchnorrPubkey::operator=(&this->schnorr_pubkey_,&object->schnorr_pubkey_);
    TaprootScriptTree::operator=(&this->script_tree_,&object->script_tree_);
    Script::operator=(&this->redeem_script_,&object->redeem_script_);
    *(undefined4 *)this->checksum_ = *(undefined4 *)object->checksum_;
    AddressFormatData::operator=(&this->format_data_,&object->format_data_);
  }
  return this;
}

Assistant:

Address& Address::operator=(const Address& object) {
  if (this != &object) {
    type_ = object.type_;
    addr_type_ = object.addr_type_;
    witness_ver_ = object.witness_ver_;
    address_ = object.address_;
    hash_ = object.hash_;
    pubkey_ = object.pubkey_;
    schnorr_pubkey_ = object.schnorr_pubkey_;
    script_tree_ = object.script_tree_;
    redeem_script_ = object.redeem_script_;
    memcpy(checksum_, object.checksum_, sizeof(checksum_));
    format_data_ = object.format_data_;
  }
  return *this;
}